

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

size_t __thiscall
google::protobuf::compiler::cpp::MessageGenerator::HasBitsSize(MessageGenerator *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = this->max_has_bit_index_ + 0x1f;
  uVar1 = this->max_has_bit_index_ + 0x3e;
  if ((int)uVar3 < 0) {
    uVar3 = uVar1;
  }
  iVar2 = 4;
  if (0x3e < uVar1) {
    iVar2 = ((int)uVar3 >> 5) << 2;
  }
  return (long)iVar2;
}

Assistant:

size_t MessageGenerator::HasBitsSize() const {
  size_t sizeof_has_bits = (max_has_bit_index_ + 31) / 32 * 4;
  if (sizeof_has_bits == 0) {
    // Zero-size arrays aren't technically allowed, and MSVC in particular
    // doesn't like them.  We still need to declare these arrays to make
    // other code compile.  Since this is an uncommon case, we'll just declare
    // them with size 1 and waste some space.  Oh well.
    sizeof_has_bits = 4;
  }

  return sizeof_has_bits;
}